

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Logical_And_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::eval_internal
          (Logical_And_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,Dispatch_State *t_ss)

{
  bool bVar1;
  bool b;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  undefined1 auStack_48 [16];
  undefined1 local_38 [16];
  
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)local_38,
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)local_38,in_RDX);
  if (bVar1) {
    AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::eval
              ((AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_> *)auStack_48,
               *(Dispatch_State **)
                ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock +
                8));
    b = AST_Node::get_bool_condition((Boxed_Value *)auStack_48,in_RDX);
  }
  else {
    b = false;
  }
  const_var((chaiscript *)this,b);
  if (bVar1) {
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        return const_var(this->get_bool_condition(this->children[0]->eval(t_ss), t_ss)
                         && this->get_bool_condition(this->children[1]->eval(t_ss), t_ss));
      }